

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall Diligent::DeviceContextVkImpl::ResetRenderTargets(DeviceContextVkImpl *this)

{
  RenderingInfoWrapper *__ptr;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::ResetRenderTargets
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
  EndRenderScope(this);
  this->m_vkRenderPass = (VkRenderPass)0x0;
  this->m_vkFramebuffer = (VkFramebuffer)0x0;
  __ptr = (this->m_DynamicRenderingInfo)._M_t.
          super___uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
          ._M_t.
          super__Tuple_impl<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
          .super__Head_base<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_false>._M_head_impl;
  (this->m_DynamicRenderingInfo)._M_t.
  super___uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
  ._M_t.
  super__Tuple_impl<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
  .super__Head_base<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_false>._M_head_impl =
       (RenderingInfoWrapper *)0x0;
  if (__ptr != (RenderingInfoWrapper *)0x0) {
    std::default_delete<VulkanUtilities::RenderingInfoWrapper>::operator()
              ((default_delete<VulkanUtilities::RenderingInfoWrapper> *)
               &this->m_DynamicRenderingInfo,__ptr);
  }
  (this->m_State).ShadingRateIsSet = false;
  return;
}

Assistant:

void DeviceContextVkImpl::ResetRenderTargets()
{
    TDeviceContextBase::ResetRenderTargets();
    EndRenderScope();
    m_vkRenderPass  = VK_NULL_HANDLE;
    m_vkFramebuffer = VK_NULL_HANDLE;
    m_DynamicRenderingInfo.reset();
    m_State.ShadingRateIsSet = false;
}